

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<char[20],int,int,int>
          (Capturer *this,size_t index,char (*value) [20],int *values,int *values_1,int *values_2)

{
  string local_58;
  int *local_38;
  int *values_local_2;
  int *values_local_1;
  int *values_local;
  char (*value_local) [20];
  size_t index_local;
  Capturer *this_local;
  
  local_38 = values_2;
  values_local_2 = values_1;
  values_local_1 = values;
  values_local = (int *)value;
  value_local = (char (*) [20])index;
  index_local = (size_t)this;
  Detail::stringify<char[20]>(&local_58,value);
  captureValue(this,index,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  captureValues<int,int,int>(this,(size_t)(*value_local + 1),values_local_1,values_local_2,local_38)
  ;
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }